

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O0

size_t __thiscall proto2_unittest::ComplexOptionType1::ByteSizeLong(ComplexOptionType1 *this)

{
  uint uVar1;
  int size;
  int32_t iVar2;
  RepeatedField<int> *value;
  size_t sVar3;
  size_t sVar4;
  uint32_t *puVar5;
  size_t tag_size;
  size_t data_size;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  ComplexOptionType1 *this_;
  ComplexOptionType1 *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  sStack_58 = google::protobuf::internal::ExtensionSet::ByteSize
                        (&(this->field_0)._impl_._extensions_);
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  value = _internal_foo4(this);
  sVar3 = google::protobuf::internal::WireFormatLite::Int32Size(value);
  size = _internal_foo4_size(this);
  sVar4 = google::protobuf::internal::FromIntSize(size);
  sStack_58 = sVar4 + sVar3 + sStack_58;
  puVar5 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar5;
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      iVar2 = _internal_foo(this);
      sVar3 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar2);
      sStack_58 = sVar3 + sStack_58;
    }
    if ((uVar1 & 2) != 0) {
      iVar2 = _internal_foo2(this);
      sVar3 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar2);
      sStack_58 = sVar3 + sStack_58;
    }
    if ((uVar1 & 4) != 0) {
      iVar2 = _internal_foo3(this);
      sVar3 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar2);
      sStack_58 = sVar3 + sStack_58;
    }
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t ComplexOptionType1::ByteSizeLong() const {
  const ComplexOptionType1& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.ComplexOptionType1)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 foo4 = 4;
    {
      ::size_t data_size = ::_pbi::WireFormatLite::Int32Size(
          this_._internal_foo4());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_foo4_size());
      total_size += tag_size + data_size;
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    // optional int32 foo = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_foo());
    }
    // optional int32 foo2 = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_foo2());
    }
    // optional int32 foo3 = 3;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_foo3());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}